

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O1

QString * __thiscall
QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
          (QString *__return_storage_ptr__,QSqlRelationalTableModelPrivate *this,QString *tableName,
          QString *fieldName)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  long lVar3;
  QChar QVar4;
  QString *pQVar5;
  long lVar6;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar6 = (tableName->d).size + (fieldName->d).size + 1;
  pDVar2 = (__return_storage_ptr__->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar2->super_QArrayData).alloc -
      ((long)((long)(__return_storage_ptr__->d).ptr -
             ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1) <=
      lVar6)) {
    lVar3 = (__return_storage_ptr__->d).size;
    if (lVar6 < lVar3) {
      lVar6 = lVar3;
    }
    QString::reallocData((longlong)__return_storage_ptr__,(AllocationOption)lVar6);
  }
  pDVar2 = (__return_storage_ptr__->d).d;
  if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
    pAVar1 = &(pDVar2->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  QVar4.ucs = QString::append(__return_storage_ptr__);
  pQVar5 = (QString *)QString::append(QVar4);
  QString::append(pQVar5);
  return __return_storage_ptr__;
}

Assistant:

QString QSqlRelationalTableModelPrivate::fullyQualifiedFieldName(const QString &tableName,
                                                                 const QString &fieldName) const
{
    QString ret;
    ret.reserve(tableName.size() + fieldName.size() + 1);
    ret.append(tableName).append(u'.').append(fieldName);

    return ret;
}